

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O3

Endpoint * __thiscall
helics::MessageFederate::getEndpoint(MessageFederate *this,string_view eptName)

{
  MessageFederateManager *this_00;
  Endpoint *pEVar1;
  string_view name;
  string local_48;
  
  pEVar1 = MessageFederateManager::getEndpoint
                     ((this->mfManager)._M_t.
                      super___uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
                      .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl,
                      (string_view)eptName);
  if ((pEVar1->super_Interface).handle.hid == -1700000000) {
    this_00 = (this->mfManager)._M_t.
              super___uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
              .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl;
    Federate::localNameGenerator_abi_cxx11_
              (&local_48,
               (Federate *)
               ((long)&this->_vptr_MessageFederate + (long)this->_vptr_MessageFederate[-3]),eptName)
    ;
    name._M_str = local_48._M_dataplus._M_p;
    name._M_len = local_48._M_string_length;
    pEVar1 = MessageFederateManager::getEndpoint(this_00,name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return pEVar1;
}

Assistant:

Endpoint& MessageFederate::getEndpoint(std::string_view eptName) const
{
    auto& ept = mfManager->getEndpoint(eptName);
    if (!ept.isValid()) {
        return mfManager->getEndpoint(localNameGenerator(eptName));
    }
    return ept;
}